

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

char * Abc_SopDecoderPos(Mem_Flex_t *pMan,int nValues)

{
  char cVar1;
  uint uVar2;
  int Num;
  Vec_Str_t *p;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  int i;
  long lVar6;
  long lVar7;
  int iVar8;
  size_t sVar9;
  
  if (nValues < 2) {
    __assert_fail("nValues > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcSop.c"
                  ,0x475,"char *Abc_SopDecoderPos(Mem_Flex_t *, int)");
  }
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  pcVar3 = (char *)malloc(100);
  p->pArray = pcVar3;
  Num = 0;
  do {
    iVar8 = 0;
    do {
      lVar7 = (long)p->nSize;
      uVar5 = p->nCap;
      pcVar3 = p->pArray;
      if (iVar8 == Num) {
        lVar6 = 0;
        do {
          cVar1 = "X9K 6TX9( 6+T9X 6Xj9( :X6+j Xj(9Tn s:X6+ 9Gn G&6X 9H6X Ga9n 1G9n :Gn 6HX91 "
                  [lVar6 + 0x49];
          if ((uint)lVar7 == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (pcVar3 == (char *)0x0) {
                pcVar3 = (char *)malloc(0x10);
              }
              else {
                pcVar3 = (char *)realloc(pcVar3,0x10);
              }
              uVar5 = 0x10;
            }
            else {
              uVar2 = uVar5 * 2;
              if (SBORROW4(uVar5,uVar2) != 0 < (int)uVar5) {
                uVar5 = uVar2;
                if (pcVar3 == (char *)0x0) {
                  pcVar3 = (char *)malloc((ulong)uVar2);
                }
                else {
                  pcVar3 = (char *)realloc(pcVar3,(ulong)uVar2);
                }
              }
            }
          }
          pcVar3[lVar7] = cVar1;
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 2);
      }
      else {
        lVar6 = 0;
        do {
          cVar1 = "    - "[lVar6 + 4];
          if ((uint)lVar7 == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (pcVar3 == (char *)0x0) {
                pcVar3 = (char *)malloc(0x10);
              }
              else {
                pcVar3 = (char *)realloc(pcVar3,0x10);
              }
              uVar5 = 0x10;
            }
            else {
              uVar2 = uVar5 * 2;
              if (SBORROW4(uVar5,uVar2) != 0 < (int)uVar5) {
                uVar5 = uVar2;
                if (pcVar3 == (char *)0x0) {
                  pcVar3 = (char *)malloc((ulong)uVar2);
                }
                else {
                  pcVar3 = (char *)realloc(pcVar3,(ulong)uVar2);
                }
              }
            }
          }
          pcVar3[lVar7] = cVar1;
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 2);
      }
      p->nSize = (int)lVar7;
      p->nCap = uVar5;
      p->pArray = pcVar3;
      iVar8 = iVar8 + 1;
    } while (iVar8 != nValues);
    Vec_StrPrintNum(p,Num);
    uVar5 = p->nSize;
    uVar2 = p->nCap;
    if (uVar5 == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(0x10);
        }
        else {
          pcVar3 = (char *)realloc(p->pArray,0x10);
        }
        sVar9 = 0x10;
      }
      else {
        sVar9 = (ulong)uVar2 * 2;
        if ((int)sVar9 <= (int)uVar2) goto LAB_0087b245;
        if (p->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(sVar9);
        }
        else {
          pcVar3 = (char *)realloc(p->pArray,sVar9);
        }
      }
      p->pArray = pcVar3;
      p->nCap = (int)sVar9;
    }
LAB_0087b245:
    p->nSize = uVar5 + 1;
    p->pArray[(int)uVar5] = '\n';
    Num = Num + 1;
  } while (Num != nValues);
  uVar5 = p->nSize;
  uVar2 = p->nCap;
  if (uVar5 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (p->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(p->pArray,0x10);
      }
      sVar9 = 0x10;
    }
    else {
      sVar9 = (ulong)uVar2 * 2;
      if ((int)sVar9 <= (int)uVar2) goto LAB_0087b2d4;
      if (p->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar9);
      }
      else {
        pcVar3 = (char *)realloc(p->pArray,sVar9);
      }
    }
    p->pArray = pcVar3;
    p->nCap = (int)sVar9;
  }
LAB_0087b2d4:
  pcVar3 = p->pArray;
  p->nSize = uVar5 + 1;
  pcVar3[(int)uVar5] = '\0';
  pcVar4 = Abc_SopRegister(pMan,pcVar3);
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
    p->pArray = (char *)0x0;
  }
  free(p);
  return pcVar4;
}

Assistant:

char * Abc_SopDecoderPos( Mem_Flex_t * pMan, int nValues )
{
    char * pResult;
    Vec_Str_t * vSop;
    int i, k;
    assert( nValues > 1 );
    vSop = Vec_StrAlloc( 100 );
    for ( i = 0; i < nValues; i++ )
    {
        for ( k = 0; k < nValues; k++ )
        {
            if ( k == i )
                Vec_StrPrintStr( vSop, "1 " );
            else
                Vec_StrPrintStr( vSop, "- " );
        }
        Vec_StrPrintNum( vSop, i );
        Vec_StrPush( vSop, '\n' );
    }
    Vec_StrPush( vSop, 0 );
    pResult = Abc_SopRegister( pMan, Vec_StrArray(vSop) );
    Vec_StrFree( vSop );
    return pResult;
}